

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatype.h
# Opt level: O0

void kException_Init(KonohaContext *kctx,kObject_conflict *o,void *conf)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  kString *msg;
  kExceptionVar *e;
  long local_30;
  
  local_30 = in_RDX;
  if (in_RDX == 0) {
    local_30 = *(long *)(*(long *)(in_RDI + 0x20) + 0x48);
  }
  (**(code **)(*(long *)(in_RDI + 0x10) + 0x240))(in_RSI,*(undefined8 *)(in_RSI + 0x28),local_30);
  *(long *)(in_RSI + 0x28) = local_30;
  *(undefined8 *)(in_RSI + 0x20) = 0;
  *(undefined4 *)(in_RSI + 0x18) = 0;
  *(undefined4 *)(in_RSI + 0x1c) = 0;
  (**(code **)(*(long *)(in_RDI + 0x10) + 0x240))
            (in_RSI,*(undefined8 *)(in_RSI + 0x30),*(undefined8 *)(*(long *)(in_RDI + 0x20) + 0x50))
  ;
  *(undefined8 *)(in_RSI + 0x30) = *(undefined8 *)(*(long *)(in_RDI + 0x20) + 0x50);
  return;
}

Assistant:

static void kException_Init(KonohaContext *kctx, kObject *o, void *conf)
{
	kExceptionVar *e = (kExceptionVar *)o;
	kString *msg = conf == NULL ? TS_EMPTY : (kString *)conf;
	KFieldInit(e, e->Message, msg);
	//DBG_ASSERT(IS_String(msg));
	e->uline  = 0;
	e->symbol = 0;
	e->fault  = 0;
	KFieldInit(e, e->StackTraceList, K_EMPTYARRAY);
}